

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

short duckdb::DecimalScaleDownOperator::Operation<short,short>
                (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  short sVar2;
  DecimalScaleInput<short,_short> *data;
  undefined6 in_register_0000003a;
  
  sVar1 = (short)((long)((ulong)(uint)((int)CONCAT62(in_register_0000003a,input) >> 0x1f) << 0x20 |
                        CONCAT62(in_register_0000003a,input) & 0xffffffff) /
                 (long)(int)(*(short *)((long)dataptr + 0x22) / 2));
  sVar2 = sVar1 + 1;
  if (sVar1 < 0) {
    sVar2 = sVar1 + -1;
  }
  sVar2 = Cast::Operation<short,short>(sVar2 / 2);
  return sVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}